

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::clean(ArrayKernel *this)

{
  _Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->vertices_).
                super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->vertices_).
                super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (local_28._M_impl.super__Vector_impl_data._M_finish !=
      local_28._M_impl.super__Vector_impl_data._M_start) {
    (this->vertices_).
    super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_28._M_impl.super__Vector_impl_data._M_start;
    local_28._M_impl.super__Vector_impl_data._M_finish =
         local_28._M_impl.super__Vector_impl_data._M_start;
  }
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->vertices_).
                super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
  ~_Vector_base((_Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                 *)&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (this->edges_).
       super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (this->edges_).
       super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (local_28._M_impl.super__Vector_impl_data._M_finish !=
      local_28._M_impl.super__Vector_impl_data._M_start) {
    (this->edges_).
    super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_28._M_impl.super__Vector_impl_data._M_start;
    local_28._M_impl.super__Vector_impl_data._M_finish =
         local_28._M_impl.super__Vector_impl_data._M_start;
  }
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->edges_).
       super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::
  ~_Vector_base(&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->faces_).
                super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->faces_).
                super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (local_28._M_impl.super__Vector_impl_data._M_finish !=
      local_28._M_impl.super__Vector_impl_data._M_start) {
    (this->faces_).
    super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_28._M_impl.super__Vector_impl_data._M_start;
    local_28._M_impl.super__Vector_impl_data._M_finish =
         local_28._M_impl.super__Vector_impl_data._M_start;
  }
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->faces_).
                super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
  ~_Vector_base((_Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                 *)&local_28);
  return;
}

Assistant:

void ArrayKernel::clean()
{

  vertices_.clear();
  VertexContainer().swap( vertices_ );

  edges_.clear();
  EdgeContainer().swap( edges_ );

  faces_.clear();
  FaceContainer().swap( faces_ );

}